

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastEvR1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  char cVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  RepeatedField<int> *this;
  uint *puVar5;
  ulong uVar6;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar7;
  ulong uVar8;
  ushort *puVar9;
  int value;
  char *pcVar10;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar10 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar10;
  }
  this = RefAt<google::protobuf::RepeatedField<int>>(msg,(ulong)data.field_0 >> 0x30);
  cVar1 = *ptr;
  puVar5 = *(uint **)((long)&table->has_bits_offset +
                     ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset);
  do {
    pcVar10 = (char *)(long)*(char *)((long)ptr + 1);
    if ((long)pcVar10 < 0) {
      uVar8 = (long)(char)*(ushort *)((long)ptr + 2) << 7 | 0x7f;
      if ((long)uVar8 < 0) {
        aVar7.data = (long)*(char *)((long)ptr + 3) << 0xe | 0x3fff;
        if ((long)aVar7 < 0) {
          uVar8 = uVar8 & ((long)(char)*(ushort *)((long)ptr + 4) << 0x15 | 0x1fffffU);
          if ((long)uVar8 < 0) {
            aVar7.data = aVar7.data & ((long)*(char *)((long)ptr + 5) << 0x1c | 0xfffffffU);
            if ((long)aVar7.data < 0) {
              uVar8 = uVar8 & ((long)(char)*(ushort *)((long)ptr + 6) << 0x23 | 0x7ffffffffU);
              if ((long)uVar8 < 0) {
                aVar7.data = aVar7.data & ((long)*(char *)((long)ptr + 7) << 0x2a | 0x3ffffffffffU);
                if ((long)aVar7 < 0) {
                  uVar8 = uVar8 & ((long)(char)*(ushort *)((long)ptr + 8) << 0x31 | 0x1ffffffffffffU
                                  );
                  if ((long)uVar8 < 0) {
                    uVar6 = (ulong)*(byte *)((long)ptr + 9) << 0x38 | 0xffffffffffffff;
                    aVar7.data = aVar7.data & uVar6;
                    if ((long)aVar7 < 0) {
                      puVar9 = (ushort *)((long)ptr + 0xb);
                      cVar2 = (char)*(ushort *)((long)ptr + 10);
                      if ((cVar2 != '\x01') && (cVar2 < '\0')) {
                        pcVar10 = Error(msg,pcVar10,
                                        (ParseContext *)CONCAT71((int7)(uVar6 >> 8),cVar2),
                                        (TcFieldData)aVar7,table,hasbits);
                        return pcVar10;
                      }
                    }
                    else {
                      puVar9 = (ushort *)((long)ptr + 10);
                    }
                  }
                  else {
                    puVar9 = (ushort *)((long)ptr + 9);
                  }
                }
                else {
                  puVar9 = (ushort *)((long)ptr + 8);
                }
              }
              else {
                puVar9 = (ushort *)((long)ptr + 7);
              }
            }
            else {
              puVar9 = (ushort *)((long)ptr + 6);
            }
          }
          else {
            puVar9 = (ushort *)((long)ptr + 5);
          }
        }
        else {
          puVar9 = (ushort *)((long)ptr + 4);
        }
        uVar8 = uVar8 & aVar7.data;
      }
      else {
        puVar9 = (ushort *)((long)ptr + 3);
      }
      pcVar10 = (char *)((ulong)pcVar10 & uVar8);
    }
    else {
      puVar9 = (ushort *)((long)ptr + 2);
    }
    uVar8 = (ulong)(*puVar5 >> 0x10);
    value = (int)pcVar10;
    uVar6 = (long)value - (long)(short)*puVar5;
    aVar7.data = uVar6 - uVar8;
    if (uVar8 <= uVar6) {
      uVar4 = puVar5[1];
      if ((ulong)aVar7 < (ulong)(uVar4 & 0xffff)) {
        if ((puVar5[(aVar7.data >> 5) + 2] >> ((uint)aVar7.data & 0x1f) & 1) == 0) {
LAB_00238bfb:
          pcVar10 = FastUnknownEnumFallback(msg,ptr,ctx,(TcFieldData)aVar7,table,hasbits);
          return pcVar10;
        }
      }
      else {
        aVar7._0_4_ = uVar4 >> 0x10;
        aVar7.data._4_4_ = 0;
        uVar8 = 0;
        do {
          if (aVar7.data <= uVar8) goto LAB_00238bfb;
          iVar3 = *(int *)((long)puVar5 + uVar8 * 4 + (ulong)(uVar4 >> 3 & 0x1ffc) + 8);
          uVar8 = (uVar8 * 2 - (ulong)(value < iVar3)) + 2;
        } while (iVar3 != value);
      }
    }
    RepeatedField<int>::Add(this,value);
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar9) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar5 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
        *puVar5 = *puVar5 | (uint)hasbits;
      }
      return (char *)puVar9;
    }
    ptr = (char *)puVar9;
    if ((char)*puVar9 != cVar1) {
      uVar4 = (uint)table->fast_idx_mask & (uint)*puVar9;
      if ((uVar4 & 7) == 0) {
        uVar8 = (ulong)(uVar4 & 0xfffffff8);
        pcVar10 = (char *)(**(code **)(&table[1].has_bits_offset + uVar8))
                                    (msg,puVar9,ctx,
                                     (ulong)*puVar9 ^
                                     *(ulong *)(&table[1].fast_idx_mask + uVar8 * 2),table,hasbits);
        return pcVar10;
      }
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
  } while( true );
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastEvR1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedEnum<uint8_t, field_layout::kTvEnum>(
      PROTOBUF_TC_PARAM_PASS);
}